

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::logSingleOperationCalculationInfo
          (FunctionCase *this)

{
  ostringstream *this_00;
  MessageBuilder local_190;
  
  local_190.m_log =
       ((this->super_OperatorPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Note: program ");
  std::ostream::operator<<(this_00,0);
  std::operator<<((ostream *)this_00," contains ");
  std::ostream::operator<<(this_00,4);
  std::operator<<((ostream *)this_00," calls to \'");
  std::operator<<((ostream *)this_00,(string *)&this->m_func);
  std::operator<<((ostream *)this_00,"\' in one loop iteration; ");
  std::operator<<((ostream *)this_00,"cost of one operation is calculated as ");
  std::operator<<((ostream *)this_00,
                  "(cost_of_workload_with_calls - cost_of_workload_without_calls) / ");
  std::ostream::operator<<(this_00,4);
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void FunctionCase::logSingleOperationCalculationInfo (void) const
{
	const int numFunctionCalls = FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS;

	m_testCtx.getLog() << TestLog::Message << "Note: program " << (int)PROGRAM_WITH_FUNCTION_CALLS << " contains "
										   << numFunctionCalls << " calls to '" << m_func << "' in one loop iteration; "
										   << "cost of one operation is calculated as "
										   << "(cost_of_workload_with_calls - cost_of_workload_without_calls) / " << numFunctionCalls << TestLog::EndMessage;
}